

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
          (SmallVectorBase<slang::parsing::Trivia> *this,Trivia *args)

{
  ulong uVar1;
  pointer p;
  undefined8 uVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  long lVar6;
  long lVar7;
  pointer __src;
  size_type sVar8;
  ulong uVar9;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    uVar2 = *(undefined8 *)((long)&args->field_0 + 8);
    (__src->field_0).rawText.ptr = (args->field_0).rawText.ptr;
    *(undefined8 *)((long)&__src->field_0 + 8) = uVar2;
    sVar8 = this->len;
    this->len = sVar8 + 1;
    return this->data_ + sVar8;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar9 = this->len + 1;
  uVar1 = this->cap;
  if (uVar9 < uVar1 * 2) {
    uVar9 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar9 = 0x7ffffffffffffff;
  }
  lVar7 = (long)__src - (long)this->data_;
  pTVar3 = (pointer)operator_new(uVar9 << 4);
  uVar2 = *(undefined8 *)((long)&args->field_0 + 8);
  *(undefined8 *)((long)pTVar3 + lVar7) = (args->field_0).rawText.ptr;
  ((undefined8 *)((long)pTVar3 + lVar7))[1] = uVar2;
  p = this->data_;
  sVar8 = this->len;
  lVar6 = (long)p + (sVar8 * 0x10 - (long)__src);
  pTVar4 = p;
  pTVar5 = pTVar3;
  if (lVar6 == 0) {
    pTVar4 = pTVar3;
    pTVar5 = p;
    if (sVar8 != 0) {
      do {
        uVar2 = *(undefined8 *)((long)&pTVar5->field_0 + 8);
        (pTVar4->field_0).rawText.ptr = (pTVar5->field_0).rawText.ptr;
        *(undefined8 *)((long)&pTVar4->field_0 + 8) = uVar2;
        pTVar5 = pTVar5 + 1;
        pTVar4 = pTVar4 + 1;
      } while (pTVar5 != __src);
    }
  }
  else {
    for (; pTVar4 != __src; pTVar4 = pTVar4 + 1) {
      uVar2 = *(undefined8 *)((long)&pTVar4->field_0 + 8);
      (pTVar5->field_0).rawText.ptr = (pTVar4->field_0).rawText.ptr;
      *(undefined8 *)((long)&pTVar5->field_0 + 8) = uVar2;
      pTVar5 = pTVar5 + 1;
    }
    memcpy((void *)((long)pTVar3 + lVar7 + 0x10),__src,(lVar6 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar8 = this->len;
  }
  this->len = sVar8 + 1;
  this->cap = uVar9;
  this->data_ = pTVar3;
  return (reference)((long)pTVar3 + lVar7);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }